

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

void apprun_print_envp(char **envp)

{
  char *pcVar1;
  char **ppcVar2;
  
  fwrite("  envp: [ \n",0xb,1,_stderr);
  if ((envp != (char **)0x0) && (*envp != (char *)0x0)) {
    ppcVar2 = envp + 1;
    do {
      fprintf(_stderr,"    \"%s\"");
      if (*ppcVar2 == (char *)0x0) break;
      fwrite(", \n",3,1,_stderr);
      pcVar1 = *ppcVar2;
      ppcVar2 = ppcVar2 + 1;
    } while (pcVar1 != (char *)0x0);
  }
  fwrite("\n  ]\n",5,1,_stderr);
  return;
}

Assistant:

void apprun_print_envp(char *const *envp) {
    fprintf(stderr, "  envp: [ \n");
    if (envp) {
        for (char *const *itr = envp; *itr != 0; itr++) {
            fprintf(stderr, "    \"%s\"", *itr);
            if (*(itr + 1) != NULL)
                fprintf(stderr, ", \n");
        }
    }
    fprintf(stderr, "\n  ]\n");
}